

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversionTypeParser.cpp
# Opt level: O3

InversionType * __thiscall
OpenMD::InversionTypeParser::parseLine(InversionTypeParser *this,string *line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  iterator iVar3;
  AmberImproperTorsionType *this_00;
  OpenMDException *pOVar4;
  _Rb_tree_color _Var5;
  uint uVar6;
  RealType RVar7;
  vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
  parameters;
  ImproperCosineInversionParameter currParam;
  StringTokenizer tokenizer;
  string local_c8;
  RealType local_a8;
  double local_a0;
  ImproperCosineInversionParameter local_98;
  StringTokenizer local_80;
  
  paVar1 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_80,line,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,(ulong)(local_c8.field_2._M_allocated_capacity + 1));
  }
  uVar2 = StringTokenizer::countTokens(&local_80);
  if ((int)uVar2 < 1) {
    pOVar4 = (OpenMDException *)__cxa_allocate_exception(0x28);
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"InversionTypeParser: Not enough tokens","");
    OpenMDException::OpenMDException(pOVar4,&local_c8);
    __cxa_throw(pOVar4,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  StringTokenizer::nextToken_abi_cxx11_(&local_c8,&local_80);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>_>
                  *)this,&local_c8);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header) {
    _Var5 = 5;
  }
  else {
    _Var5 = iVar3._M_node[2]._M_color;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,(ulong)(local_c8.field_2._M_allocated_capacity + 1));
  }
  if (_Var5 == _S_red) {
    if ((uVar2 < 4) || (uVar6 = (uVar2 - 1) / 3, (uVar2 - 1) % 3 != 0)) {
      pOVar4 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"InversionTypeParser: Not enough tokens","");
      OpenMDException::OpenMDException(pOVar4,&local_c8);
      __cxa_throw(pOVar4,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_c8._M_dataplus._M_p = (pointer)0x0;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_allocated_capacity = 0;
    do {
      local_98.kchi = StringTokenizer::nextTokenAsDouble(&local_80);
      local_98.n = StringTokenizer::nextTokenAsInt(&local_80);
      RVar7 = StringTokenizer::nextTokenAsDouble(&local_80);
      local_98.delta = (RVar7 / 180.0) * 3.141592653589793;
      if (local_c8._M_string_length == local_c8.field_2._M_allocated_capacity) {
        std::
        vector<OpenMD::ImproperCosineInversionParameter,std::allocator<OpenMD::ImproperCosineInversionParameter>>
        ::_M_realloc_insert<OpenMD::ImproperCosineInversionParameter_const&>
                  ((vector<OpenMD::ImproperCosineInversionParameter,std::allocator<OpenMD::ImproperCosineInversionParameter>>
                    *)&local_c8,(iterator)local_c8._M_string_length,&local_98);
      }
      else {
        *(RealType *)(local_c8._M_string_length + 0x10) = local_98.delta;
        *(RealType *)local_c8._M_string_length = local_98.kchi;
        *(ulong *)(local_c8._M_string_length + 8) = CONCAT44(local_98._12_4_,local_98.n);
        local_c8._M_string_length = local_c8._M_string_length + 0x18;
      }
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
    this_00 = (AmberImproperTorsionType *)operator_new(0x38);
    ImproperCosineInversionType::ImproperCosineInversionType
              ((ImproperCosineInversionType *)this_00,
               (vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
                *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_c8._M_dataplus._M_p,
                      local_c8.field_2._M_allocated_capacity - (long)local_c8._M_dataplus._M_p);
    }
  }
  else if (_Var5 == _S_black) {
    if (uVar2 < 3) {
      pOVar4 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"InversionTypeParser: Not enough tokens","");
      OpenMDException::OpenMDException(pOVar4,&local_c8);
      __cxa_throw(pOVar4,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_a8 = StringTokenizer::nextTokenAsDouble(&local_80);
    local_a0 = StringTokenizer::nextTokenAsDouble(&local_80);
    this_00 = (AmberImproperTorsionType *)operator_new(0x18);
    (this_00->super_PolynomialInversionType).super_InversionType._vptr_InversionType =
         (_func_int **)&PTR__InversionType_002ac078;
    *(double *)&(this_00->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl =
         local_a8 * 3282.806350011744;
    *(double *)
     &(this_00->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.
      super__Rb_tree_header._M_header = local_a0 / 57.29577951308232;
  }
  else {
    if (_Var5 != 3) {
      pOVar4 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"InversionTypeParser: Unknown Inversion Type","");
      OpenMDException::OpenMDException(pOVar4,&local_c8);
      __cxa_throw(pOVar4,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    if (uVar2 == 1) {
      pOVar4 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"InversionTypeParser: Not enough tokens","");
      OpenMDException::OpenMDException(pOVar4,&local_c8);
      __cxa_throw(pOVar4,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_a8 = StringTokenizer::nextTokenAsDouble(&local_80);
    this_00 = (AmberImproperTorsionType *)operator_new(0x40);
    AmberImproperTorsionType::AmberImproperTorsionType(this_00,local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.delim_._M_dataplus._M_p != &local_80.delim_.field_2) {
    operator_delete(local_80.delim_._M_dataplus._M_p,
                    local_80.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.tokenString_._M_dataplus._M_p != &local_80.tokenString_.field_2) {
    operator_delete(local_80.tokenString_._M_dataplus._M_p,
                    local_80.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return (InversionType *)this_00;
}

Assistant:

InversionType* InversionTypeParser::parseLine(const std::string& line) {
    StringTokenizer tokenizer(line);
    InversionType* inversionType = NULL;

    int nTokens = tokenizer.countTokens();

    if (nTokens < 1) {
      throw OpenMDException("InversionTypeParser: Not enough tokens");
    }

    InversionTypeEnum it = getInversionTypeEnum(tokenizer.nextToken());

    nTokens -= 1;

    switch (it) {
    case itImproperCosine:

      if (nTokens < 3 || nTokens % 3 != 0) {
        throw OpenMDException("InversionTypeParser: Not enough tokens");
      } else {
        int nSets = nTokens / 3;

        std::vector<ImproperCosineInversionParameter> parameters;
        for (int i = 0; i < nSets; ++i) {
          ImproperCosineInversionParameter currParam;
          currParam.kchi  = tokenizer.nextTokenAsDouble();
          currParam.n     = tokenizer.nextTokenAsInt();
          currParam.delta = tokenizer.nextTokenAsDouble() / 180.0 *
                            Constants::PI;  // convert to rad
          parameters.push_back(currParam);
        }
        inversionType = new ImproperCosineInversionType(parameters);
      }

      break;

    case itAmberImproper:

      if (nTokens < 1) {
        throw OpenMDException("InversionTypeParser: Not enough tokens");
      } else {
        RealType v2   = tokenizer.nextTokenAsDouble();
        inversionType = new AmberImproperTorsionType(v2);
      }

      break;

    case itHarmonic:
      if (nTokens < 2) {
        throw OpenMDException("InversionTypeParser: Not enough tokens");
      } else {
        // Most inversion don't have specific angle information since
        // they are cosine polynomials.  This one is different,
        // however.  To match our other force field files
        // (particularly for bends):
        //
        // d0 should be read in kcal / mol / degrees^2
        // phi0 should be read in degrees

        RealType degreesPerRadian = 180.0 / Constants::PI;

        // convert to kcal / mol / radians^2
        RealType d0 = tokenizer.nextTokenAsDouble() * pow(degreesPerRadian, 2);

        // convert to radians
        RealType phi0 = tokenizer.nextTokenAsDouble() / degreesPerRadian;
        inversionType = new HarmonicInversionType(d0, phi0);
      }
      break;

      /*
    case itCentralAtomHeight :
      if (nTokens < 1) {
        throw OpenMDException("InversionTypeParser: Not enough tokens");
      } else {

        RealType k = tokenizer.nextTokenAsDouble();

        inversionType = new CentralAtomHeightInversionType(k);
      }
      break;
    case itDreiding :
      if (nTokens < 3) {
        throw OpenMDException("InversionTypeParser: Not enough tokens");
      } else {

        RealType k = tokenizer.nextTokenAsDouble();

        inversionType = new CentralAtomHeightInversionType(k);
      }
      break;
      */
    case itUnknown:
    default:
      throw OpenMDException("InversionTypeParser: Unknown Inversion Type");
    }
    return inversionType;
  }